

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_service(lws_context *context,int timeout_ms)

{
  int n;
  lws_context_per_thread *pt;
  int timeout_ms_local;
  lws_context *context_local;
  
  if (context == (lws_context *)0x0) {
    context_local._4_4_ = 1;
  }
  else {
    context->pt[0].field_0x19b = context->pt[0].field_0x19b & 0xfe | 1;
    if (context->event_loop_ops->run_pt == (_func_void_lws_context_ptr_int *)0x0) {
      context_local._4_4_ = lws_plat_service(context,timeout_ms);
      if (context_local._4_4_ != -1) {
        context->pt[0].field_0x19b = context->pt[0].field_0x19b & 0xfe;
      }
    }
    else {
      (*context->event_loop_ops->run_pt)(context,0);
      context->pt[0].field_0x19b = context->pt[0].field_0x19b & 0xfe;
      context_local._4_4_ = 1;
    }
  }
  return context_local._4_4_;
}

Assistant:

int
lws_service(struct lws_context *context, int timeout_ms)
{
	struct lws_context_per_thread *pt;
	int n;

	if (!context)
		return 1;

	pt = &context->pt[0];
	pt->inside_service = 1;

	if (context->event_loop_ops->run_pt) {
		/* we are configured for an event loop */
		context->event_loop_ops->run_pt(context, 0);

		pt->inside_service = 0;

		return 1;
	}
	n = lws_plat_service(context, timeout_ms);

	if (n != -1)
		pt->inside_service = 0;

	return n;
}